

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

vector<AEntity_*,_std::allocator<AEntity_*>_> * __thiscall
Api::getCurrentHand(Api *this,bool verbose)

{
  int iVar1;
  Player *pPVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppAVar6;
  undefined1 local_50 [44];
  int i;
  vector<AEntity_*,_std::allocator<AEntity_*>_> *hand;
  Api *pAStack_18;
  bool verbose_local;
  Api *this_local;
  
  hand._7_1_ = verbose;
  pAStack_18 = this;
  if (verbose) {
    pPVar2 = GameManager::get_player(&this->_game);
    iVar1 = GameManager::get_playerTurn(&this->_game);
    register0x00000000 = (Api *)Player::get_hands(pPVar2 + iVar1);
    poVar3 = std::operator<<((ostream *)&std::cout,"Hand current player :");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_50._36_4_ = 0;
    while( true ) {
      uVar4 = (ulong)(int)local_50._36_4_;
      sVar5 = std::vector<AEntity_*,_std::allocator<AEntity_*>_>::size
                        ((vector<AEntity_*,_std::allocator<AEntity_*>_> *)stack0xffffffffffffffd8);
      if (sVar5 <= uVar4) break;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_50._36_4_);
      poVar3 = std::operator<<(poVar3,": ");
      ppAVar6 = std::vector<AEntity_*,_std::allocator<AEntity_*>_>::operator[]
                          ((vector<AEntity_*,_std::allocator<AEntity_*>_> *)stack0xffffffffffffffd8,
                           (long)(int)local_50._36_4_);
      AEntity::get_reference(*ppAVar6);
      ACard::get_name_abi_cxx11_((ACard *)local_50);
      poVar3 = std::operator<<(poVar3,(string *)local_50);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_50);
      local_50._36_4_ = local_50._36_4_ + 1;
    }
    this_local = stack0xffffffffffffffd8;
  }
  else {
    pPVar2 = GameManager::get_player(&this->_game);
    iVar1 = GameManager::get_playerTurn(&this->_game);
    this_local = (Api *)Player::get_hands(pPVar2 + iVar1);
  }
  return (vector<AEntity_*,_std::allocator<AEntity_*>_> *)this_local;
}

Assistant:

const std::vector<AEntity *> &Api::getCurrentHand(bool verbose) {
    if (verbose){
        const std::vector<AEntity *> &hand = this->_game.get_player()[this->_game.get_playerTurn()].get_hands();
        std::cout << "Hand current player :" << std::endl;
        for (int i = 0; i < hand.size(); i += 1) {
            std::cout << i << ": " << hand[i]->get_reference()->get_name() << std::endl;
        }
        return hand;
    } else {
        return this->_game.get_player()[this->_game.get_playerTurn()].get_hands();
    }
}